

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::EventImport,_std::default_delete<wabt::EventImport>_> __thiscall
wabt::MakeUnique<wabt::EventImport,std::__cxx11::string&>
          (wabt *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  EventImport *this_00;
  string_view local_28;
  string *local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  
  local_18 = args;
  args_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  this_00 = (EventImport *)operator_new(0xf0);
  string_view::string_view(&local_28,local_18);
  EventImport::EventImport(this_00,local_28);
  std::unique_ptr<wabt::EventImport,std::default_delete<wabt::EventImport>>::
  unique_ptr<std::default_delete<wabt::EventImport>,void>
            ((unique_ptr<wabt::EventImport,std::default_delete<wabt::EventImport>> *)this,this_00);
  return (__uniq_ptr_data<wabt::EventImport,_std::default_delete<wabt::EventImport>,_true,_true>)
         (__uniq_ptr_data<wabt::EventImport,_std::default_delete<wabt::EventImport>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}